

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O3

void __thiscall QTextBrowser::backward(QTextBrowser *this)

{
  QTextBrowserPrivate *this_00;
  iterator iVar1;
  long in_FS_OFFSET;
  undefined1 local_a1 [57];
  HistoryEntry local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextBrowserPrivate **)
             &(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8
  ;
  if (1 < (ulong)(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size) {
    QTextBrowserPrivate::createHistoryEntry(&local_68,this_00);
    QtPrivate::QMovableArrayOps<QTextBrowserPrivate::HistoryEntry>::
    emplace<QTextBrowserPrivate::HistoryEntry_const&>
              ((QMovableArrayOps<QTextBrowserPrivate::HistoryEntry> *)&this_00->forwardStack,
               (this_00->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size,
               &local_68);
    QList<QTextBrowserPrivate::HistoryEntry>::end
              (&(this_00->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>);
    if (&(local_68.title.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.title.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.title.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_68.title.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_68.title.d.d)->super_QArrayData,2,0x10);
      }
    }
    QUrl::~QUrl(&local_68.url);
    QList<QTextBrowserPrivate::HistoryEntry>::takeLast
              ((value_type *)((long)local_a1 + 1),
               &(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>);
    if ((QArrayData *)local_a1._9_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_a1._9_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_a1._9_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_a1._9_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_a1._9_8_,2,0x10);
      }
    }
    QUrl::~QUrl((QUrl *)((long)local_a1 + 1));
    iVar1 = QList<QTextBrowserPrivate::HistoryEntry>::end
                      (&(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>);
    QTextBrowserPrivate::restoreHistoryEntry(this_00,iVar1.i + -1);
    local_a1[0] = 1 < (ulong)(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size;
    local_68.url.d = (QUrlPrivate *)0x0;
    local_68.title.d.d = (Data *)local_a1;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_68);
    local_a1[0] = 1;
    local_68.url.d = (QUrlPrivate *)0x0;
    local_68.title.d.d = (Data *)local_a1;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_68);
    QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::backward()
{
    Q_D(QTextBrowser);
    if (d->stack.size() <= 1)
        return;

    // Update the history entry
    d->forwardStack.push(d->createHistoryEntry());
    d->stack.pop(); // throw away the old version of the current entry
    d->restoreHistoryEntry(d->stack.top()); // previous entry
    emit backwardAvailable(d->stack.size() > 1);
    emit forwardAvailable(true);
    emit historyChanged();
}